

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

void y_convolve_8tap_16x2_avx2
               (uint8_t *src,ptrdiff_t stride,__m256i *coeffs,__m128i *s_128,__m256i *ss_256,
               __m256i *r)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined8 *puVar6;
  long in_RCX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  undefined1 (*in_R9) [32];
  undefined1 auVar7 [32];
  __m256i src78;
  __m256i src67;
  __m256i *coeffs_00;
  __m256i *ss;
  
  puVar6 = (undefined8 *)(in_RDI + in_RSI * 7);
  uVar1 = puVar6[1];
  *(undefined8 *)(in_RCX + 0x70) = *puVar6;
  *(undefined8 *)(in_RCX + 0x78) = uVar1;
  coeffs_00 = *(__m256i **)(in_RCX + 0x68);
  ss = *(__m256i **)(in_RCX + 0x70);
  auVar4 = *(undefined1 (*) [32])(in_RCX + 0x60);
  auVar3 = *(undefined1 (*) [32])(in_RCX + 0x60);
  puVar6 = (undefined8 *)(in_RDI + in_RSI * 8);
  uVar1 = puVar6[1];
  *(undefined8 *)(in_RCX + 0x60) = *puVar6;
  *(undefined8 *)(in_RCX + 0x68) = uVar1;
  auVar5 = *(undefined1 (*) [16])(in_RCX + 0x70);
  uVar1 = *(undefined8 *)(in_RCX + 0x60);
  uVar2 = *(undefined8 *)(in_RCX + 0x68);
  auVar7._16_8_ = uVar1;
  auVar7._0_16_ = *(undefined1 (*) [16])(in_RCX + 0x70);
  auVar7._24_8_ = uVar2;
  auVar7 = vpunpcklbw_avx2(auVar3,auVar7);
  *(undefined1 (*) [32])(in_R8 + 0x60) = auVar7;
  auVar3._16_8_ = uVar1;
  auVar3._0_16_ = auVar5;
  auVar3._24_8_ = uVar2;
  auVar7 = vpunpckhbw_avx2(auVar4,auVar3);
  *(undefined1 (*) [32])(in_R8 + 0xe0) = auVar7;
  convolve_8tap_avx2(ss,coeffs_00);
  *in_R9 = auVar7;
  convolve_8tap_avx2(ss,coeffs_00);
  in_R9[1] = auVar7;
  return;
}

Assistant:

static inline void y_convolve_8tap_16x2_avx2(const uint8_t *const src,
                                             const ptrdiff_t stride,
                                             const __m256i coeffs[4],
                                             __m128i s_128[8],
                                             __m256i ss_256[8], __m256i r[2]) {
  s_128[7] = _mm_loadu_si128((__m128i *)(src + 7 * stride));
  const __m256i src67 = _mm256_setr_m128i(s_128[6], s_128[7]);
  s_128[6] = _mm_loadu_si128((__m128i *)(src + 8 * stride));
  const __m256i src78 = _mm256_setr_m128i(s_128[7], s_128[6]);
  ss_256[3] = _mm256_unpacklo_epi8(src67, src78);
  ss_256[7] = _mm256_unpackhi_epi8(src67, src78);
  r[0] = convolve_8tap_avx2(ss_256, coeffs);
  r[1] = convolve_8tap_avx2(ss_256 + 4, coeffs);
}